

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScheduledReporter.cc
# Opt level: O2

void __thiscall
cppmetrics::ScheduledReporter::ScheduledReporter
          (ScheduledReporter *this,
          unique_ptr<cppmetrics::Reporter,_std::default_delete<cppmetrics::Reporter>_> *reporter,
          duration *duration)

{
  (this->super_Reporter)._vptr_Reporter = (_func_int **)&PTR__ScheduledReporter_0012bbe0;
  (this->m_reporter)._M_t.
  super___uniq_ptr_impl<cppmetrics::Reporter,_std::default_delete<cppmetrics::Reporter>_>._M_t.
  super__Tuple_impl<0UL,_cppmetrics::Reporter_*,_std::default_delete<cppmetrics::Reporter>_>.
  super__Head_base<0UL,_cppmetrics::Reporter_*,_false>._M_head_impl =
       (reporter->_M_t).
       super___uniq_ptr_impl<cppmetrics::Reporter,_std::default_delete<cppmetrics::Reporter>_>._M_t.
       super__Tuple_impl<0UL,_cppmetrics::Reporter_*,_std::default_delete<cppmetrics::Reporter>_>.
       super__Head_base<0UL,_cppmetrics::Reporter_*,_false>._M_head_impl;
  (reporter->_M_t).
  super___uniq_ptr_impl<cppmetrics::Reporter,_std::default_delete<cppmetrics::Reporter>_>._M_t.
  super__Tuple_impl<0UL,_cppmetrics::Reporter_*,_std::default_delete<cppmetrics::Reporter>_>.
  super__Head_base<0UL,_cppmetrics::Reporter_*,_false>._M_head_impl = (Reporter *)0x0;
  (this->m_interval).__r = duration->__r;
  (this->m_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->m_cv);
  this->m_is_running = false;
  (this->m_reporter_thread)._M_id._M_thread = 0;
  return;
}

Assistant:

ScheduledReporter::ScheduledReporter(std::unique_ptr<Reporter>&& reporter, const std::chrono::system_clock::duration& duration)
    : m_reporter(std::move(reporter))
    , m_interval(duration)
    , m_mutex()
    , m_cv()
    , m_is_running(false)
{
}